

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::lastIndexOf<QListWidgetItem*,QListWidgetItem*>
                    (QList<QListWidgetItem_*> *vector,QListWidgetItem **u,qsizetype from)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  
  uVar2 = (vector->d).size;
  qVar5 = -1;
  qVar6 = from;
  if (((-1 < from) && (qVar6 = qVar5, (ulong)from < uVar2)) || (from = uVar2 + qVar6, -1 < from)) {
    lVar4 = from * 8 + 8;
    do {
      if (lVar4 == 0) {
        return -1;
      }
      lVar1 = lVar4 + -8;
      lVar3 = lVar4 + -8;
      lVar4 = lVar1;
    } while (*(QListWidgetItem **)((long)(vector->d).ptr + lVar3) != *u);
    qVar5 = lVar1 >> 3;
  }
  return qVar5;
}

Assistant:

qsizetype lastIndexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from += vector.d->size;
    else if (from >= vector.size())
        from = vector.size() - 1;
    if (from >= 0) {
        auto b = vector.begin();
        auto n = vector.begin() + from + 1;
        while (n != b) {
            if (*--n == u)
                return qsizetype(n - b);
        }
    }
    return -1;
}